

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O3

int lj_cf_ffi_sizeof(lua_State *L)

{
  uint uVar1;
  CTypeID CVar2;
  uint uVar3;
  CTSize CVar4;
  ulong uVar5;
  CTState *cts;
  CType *ct;
  
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0xfc);
  cts->L = L;
  CVar2 = ffi_checkctype(L,cts,(TValue *)0x0);
  if (((L->base->field_2).it == 0xfffffff5) &&
     (uVar5 = (ulong)(L->base->u32).lo, *(char *)(uVar5 + 4) < '\0')) {
    CVar4 = *(CTSize *)(uVar5 - 4);
LAB_0014d154:
    L->top[-1].n = (double)(int)CVar4;
  }
  else {
    do {
      uVar3 = CVar2;
      uVar1 = cts->tab[uVar3].info;
      CVar2 = uVar1 & 0xffff;
    } while ((uVar1 & 0xf0800000) == 0x20800000);
    ct = cts->tab + uVar3;
    if ((uVar1 & 0xd0100000) == 0x10100000) {
      CVar4 = ffi_checkint(L,2);
      CVar4 = lj_ctype_vlsize(cts,ct,CVar4);
LAB_0014d14f:
      if (CVar4 != 0xffffffff) goto LAB_0014d154;
    }
    else if (uVar1 < 0x60000000) {
      CVar4 = ct->size;
      goto LAB_0014d14f;
    }
    *(undefined4 *)((long)L->top + -4) = 0xffffffff;
  }
  return 1;
}

Assistant:

LJLIB_CF(ffi_sizeof)	LJLIB_REC(ffi_xof FF_ffi_sizeof)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkctype(L, cts, NULL);
  CTSize sz;
  if (LJ_UNLIKELY(tviscdata(L->base) && cdataisv(cdataV(L->base)))) {
    sz = cdatavlen(cdataV(L->base));
  } else {
    CType *ct = lj_ctype_rawref(cts, id);
    if (ctype_isvltype(ct->info))
      sz = lj_ctype_vlsize(cts, ct, (CTSize)ffi_checkint(L, 2));
    else
      sz = ctype_hassize(ct->info) ? ct->size : CTSIZE_INVALID;
    if (LJ_UNLIKELY(sz == CTSIZE_INVALID)) {
      setnilV(L->top-1);
      return 1;
    }
  }
  setintV(L->top-1, (int32_t)sz);
  return 1;
}